

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O0

bool check_location_aliasing
               (explicit_location_info (*explicit_locations) [4],ir_variable *var,uint location,
               uint component,uint location_limit,glsl_type *type,uint interpolation,bool centroid,
               bool sample,bool patch,gl_shader_program *prog,gl_shader_stage stage)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  glsl_type *pgVar6;
  explicit_location_info *peVar7;
  char *pcVar8;
  char *local_98;
  explicit_location_info *info;
  uint comp;
  uint dmul;
  bool is_struct;
  bool base_type_is_integer;
  glsl_type *type_without_array;
  uint local_48;
  uint base_type_bit_size;
  uint last_comp;
  bool patch_local;
  bool sample_local;
  bool centroid_local;
  glsl_type *type_local;
  uint local_30;
  uint location_limit_local;
  uint component_local;
  uint location_local;
  ir_variable *var_local;
  explicit_location_info (*explicit_locations_local) [4];
  
  pgVar6 = glsl_type::without_array(type);
  bVar2 = glsl_base_type_is_integer(*(glsl_base_type *)&pgVar6->field_0x4 & 0xff);
  bVar3 = glsl_type::is_struct(pgVar6);
  local_30 = component;
  location_limit_local = location;
  if (bVar3) {
    local_48 = 4;
    type_without_array._4_4_ = 0;
  }
  else {
    bVar4 = glsl_type::is_64bit(pgVar6);
    iVar5 = 1;
    if (bVar4) {
      iVar5 = 2;
    }
    local_48 = component + (uint)pgVar6->vector_elements * iVar5;
    type_without_array._4_4_ =
         glsl_base_type_get_bit_size(*(glsl_base_type *)&pgVar6->field_0x4 & 0xff);
  }
  do {
    if (location_limit <= location_limit_local) {
      return true;
    }
    info._4_4_ = 0;
    while (info._4_4_ < 4) {
      peVar7 = explicit_locations[location_limit_local] + info._4_4_;
      if (peVar7->var == (ir_variable *)0x0) {
        if ((local_30 <= info._4_4_) && (info._4_4_ < local_48)) {
          peVar7->var = var;
          peVar7->base_type_is_integer = bVar2;
          peVar7->base_type_bit_size = type_without_array._4_4_;
          peVar7->interpolation = interpolation;
          peVar7->centroid = centroid;
          peVar7->sample = sample;
          peVar7->patch = patch;
        }
      }
      else {
        pgVar6 = glsl_type::without_array(peVar7->var->type);
        bVar4 = glsl_type::is_struct(pgVar6);
        if ((bVar4) || (bVar3)) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          if (bVar3) {
            local_98 = var->name;
          }
          else {
            local_98 = peVar7->var->name;
          }
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Struct variable \'%s\', location %u\n"
                       ,pcVar8,pcVar1 + 1,local_98,(ulong)location_limit_local);
          return false;
        }
        if ((local_30 <= info._4_4_) && (info._4_4_ < local_48)) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          linker_error(prog,
                       "%s shader has multiple %sputs explicitly assigned to location %d and component %d\n"
                       ,pcVar8,pcVar1 + 1,(ulong)location_limit_local,(ulong)info._4_4_);
          return false;
        }
        if ((bool)(peVar7->base_type_is_integer & 1U) != bVar2) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Location %u component %u.\n"
                       ,pcVar8,pcVar1 + 1,(ulong)location_limit_local,(ulong)info._4_4_);
          return false;
        }
        if (peVar7->base_type_bit_size != type_without_array._4_4_) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical bit size. Location %u component %u.\n"
                       ,pcVar8,pcVar1 + 1,(ulong)location_limit_local,(ulong)info._4_4_);
          return false;
        }
        if (peVar7->interpolation != interpolation) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same interpolation qualification. Location %u component %u.\n"
                       ,pcVar8,pcVar1 + 1,(ulong)location_limit_local,(ulong)info._4_4_);
          return false;
        }
        if ((((bool)(peVar7->centroid & 1U) != centroid) || ((bool)(peVar7->sample & 1U) != sample))
           || ((bool)(peVar7->patch & 1U) != patch)) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar1 = " out";
          if ((*(uint *)&var->data >> 0xc & 0xf) == 4) {
            pcVar1 = " in";
          }
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same auxiliary storage qualification. Location %u component %u.\n"
                       ,pcVar8,pcVar1 + 1,(ulong)location_limit_local,(ulong)info._4_4_);
          return false;
        }
      }
      info._4_4_ = info._4_4_ + 1;
      if ((info._4_4_ == 4) && (4 < local_48)) {
        local_48 = local_48 - 4;
        location_limit_local = location_limit_local + 1;
        info._4_4_ = 0;
        local_30 = 0;
      }
    }
    location_limit_local = location_limit_local + 1;
  } while( true );
}

Assistant:

static bool
check_location_aliasing(struct explicit_location_info explicit_locations[][4],
                        ir_variable *var,
                        unsigned location,
                        unsigned component,
                        unsigned location_limit,
                        const glsl_type *type,
                        unsigned interpolation,
                        bool centroid,
                        bool sample,
                        bool patch,
                        gl_shader_program *prog,
                        gl_shader_stage stage)
{
   unsigned last_comp;
   unsigned base_type_bit_size;
   const glsl_type *type_without_array = type->without_array();
   const bool base_type_is_integer =
      glsl_base_type_is_integer(type_without_array->base_type);
   const bool is_struct = type_without_array->is_struct();
   if (is_struct) {
      /* structs don't have a defined underlying base type so just treat all
       * component slots as used and set the bit size to 0. If there is
       * location aliasing, we'll fail anyway later.
       */
      last_comp = 4;
      base_type_bit_size = 0;
   } else {
      unsigned dmul = type_without_array->is_64bit() ? 2 : 1;
      last_comp = component + type_without_array->vector_elements * dmul;
      base_type_bit_size =
         glsl_base_type_get_bit_size(type_without_array->base_type);
   }

   while (location < location_limit) {
      unsigned comp = 0;
      while (comp < 4) {
         struct explicit_location_info *info =
            &explicit_locations[location][comp];

         if (info->var) {
            if (info->var->type->without_array()->is_struct() || is_struct) {
               /* Structs cannot share location since they are incompatible
                * with any other underlying numerical type.
                */
               linker_error(prog,
                            "%s shader has multiple %sputs sharing the "
                            "same location that don't have the same "
                            "underlying numerical type. Struct variable '%s', "
                            "location %u\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            is_struct ? var->name : info->var->name,
                            location);
               return false;
            } else if (comp >= component && comp < last_comp) {
               /* Component aliasing is not allowed */
               linker_error(prog,
                            "%s shader has multiple %sputs explicitly "
                            "assigned to location %d and component %d\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            location, comp);
               return false;
            } else {
               /* From the OpenGL 4.60.5 spec, section 4.4.1 Input Layout
                * Qualifiers, Page 67, (Location aliasing):
                *
                *   " Further, when location aliasing, the aliases sharing the
                *     location must have the same underlying numerical type
                *     and bit width (floating-point or integer, 32-bit versus
                *     64-bit, etc.) and the same auxiliary storage and
                *     interpolation qualification."
                */

               /* If the underlying numerical type isn't integer, implicitly
                * it will be float or else we would have failed by now.
                */
               if (info->base_type_is_integer != base_type_is_integer) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical type. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->base_type_bit_size != base_type_bit_size) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical bit size. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->interpolation != interpolation) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "interpolation qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->centroid != centroid ||
                   info->sample != sample ||
                   info->patch != patch) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "auxiliary storage qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }
            }
         } else if (comp >= component && comp < last_comp) {
            info->var = var;
            info->base_type_is_integer = base_type_is_integer;
            info->base_type_bit_size = base_type_bit_size;
            info->interpolation = interpolation;
            info->centroid = centroid;
            info->sample = sample;
            info->patch = patch;
         }

         comp++;

         /* We need to do some special handling for doubles as dvec3 and
          * dvec4 consume two consecutive locations. We don't need to
          * worry about components beginning at anything other than 0 as
          * the spec does not allow this for dvec3 and dvec4.
          */
         if (comp == 4 && last_comp > 4) {
            last_comp = last_comp - 4;
            /* Bump location index and reset the component index */
            location++;
            comp = 0;
            component = 0;
         }
      }

      location++;
   }

   return true;
}